

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_hierrarhy_visual(xr_ogf_v3 *this,xr_reader *r)

{
  size_t sVar1;
  xr_reader *s;
  
  load_render_visual(this,r);
  sVar1 = xr_reader::find_chunk(r,0xc);
  if (sVar1 != 0) {
    load_children_l(this,r);
    return;
  }
  s = xr_reader::open_chunk(r,0x11);
  if (s != (xr_reader *)0x0) {
    load_children(this,s);
    xr_reader::close_chunk(r,&s);
    return;
  }
  sVar1 = xr_reader::find_chunk(r,5);
  if (sVar1 != 0) {
    load_child_refs(this,r);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,0x35a,"void xray_re::xr_ogf_v3::load_hierrarhy_visual(xr_reader &)");
}

Assistant:

void xr_ogf_v3::load_hierrarhy_visual(xr_reader& r)
{
	load_render_visual(r);
	if (r.find_chunk(OGF3_CHILDREN_L)) {
		load_children_l(r);
		r.debug_find_chunk();
	} else {
		xr_reader* s = r.open_chunk(OGF3_CHILDREN);
		if (s) {
			load_children(*s);
			r.close_chunk(s);
		} else {
			if (!r.find_chunk(OGF3_CHILD_REFS))
				xr_not_expected();
			load_child_refs(r);
			r.debug_find_chunk();
		}
	}
}